

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::accessibleTree2Index(QTreeViewPrivate *this,QModelIndex *index)

{
  long lVar1;
  QTreeView *this_00;
  long lVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  iVar3 = QTreeView::visualIndex(this_00,index);
  lVar2 = *(long *)(*(long *)&(this_00->super_QAbstractItemView).super_QAbstractScrollArea.
                              super_QFrame.super_QWidget.field_0x8 + 0x590);
  iVar4 = (**(code **)(*(long *)(index->m).ptr + 0x80))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4 * ((iVar3 + 1) - (uint)(lVar2 == 0)) + index->c;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeViewPrivate::accessibleTree2Index(const QModelIndex &index) const
{
    Q_Q(const QTreeView);

    // Note that this will include the header, even if its hidden.
    return (q->visualIndex(index) + (q->header() ? 1 : 0)) * index.model()->columnCount() + index.column();
}